

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::
SimpleTransformPromiseNode<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::ExpectCancelResults>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++:1075:9)>
::getImpl(SimpleTransformPromiseNode<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::ExpectCancelResults>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_rpc_test_c__:1075:9)>
          *this,ExceptionOrValue *output)

{
  long *plVar1;
  ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::ExpectCancelResults>_>
  depResult;
  ExceptionOr<kj::_::Void> local_3b0;
  ExceptionOrValue local_210;
  char local_78;
  undefined8 *local_40;
  long *local_38;
  
  local_210.exception.ptr.isSet = false;
  local_78 = '\0';
  TransformPromiseNodeBase::getDepResult(&this->super_TransformPromiseNodeBase,&local_210);
  if (local_210.exception.ptr.isSet == true) {
    local_3b0.super_ExceptionOrValue.exception.ptr.isSet = true;
    local_3b0.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.ptr =
         local_210.exception.ptr.field_1.value.ownFile.content.ptr;
    local_3b0.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.size_ =
         local_210.exception.ptr.field_1.value.ownFile.content.size_;
    local_3b0.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.disposer =
         local_210.exception.ptr.field_1.value.ownFile.content.disposer;
    local_210.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    local_210.exception.ptr.field_1.value.ownFile.content.size_ = 0;
    local_3b0.super_ExceptionOrValue.exception.ptr.field_1.value.file =
         local_210.exception.ptr.field_1.value.file;
    local_3b0.super_ExceptionOrValue.exception.ptr.field_1._32_8_ =
         local_210.exception.ptr.field_1._32_8_;
    local_3b0.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.ptr =
         local_210.exception.ptr.field_1.value.description.content.ptr;
    local_3b0.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.size_ =
         local_210.exception.ptr.field_1.value.description.content.size_;
    local_3b0.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.disposer =
         local_210.exception.ptr.field_1.value.description.content.disposer;
    local_210.exception.ptr.field_1.value.description.content.ptr = (char *)0x0;
    local_210.exception.ptr.field_1.value.description.content.size_ = 0;
    local_3b0.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.disposer =
         local_210.exception.ptr.field_1.value.context.ptr.disposer;
    local_3b0.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.ptr =
         local_210.exception.ptr.field_1.value.context.ptr.ptr;
    local_210.exception.ptr.field_1.value.context.ptr.ptr = (Context *)0x0;
    local_3b0.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.ptr =
         local_210.exception.ptr.field_1.value.remoteTrace.content.ptr;
    local_3b0.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.size_ =
         local_210.exception.ptr.field_1.value.remoteTrace.content.size_;
    local_3b0.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.disposer =
         local_210.exception.ptr.field_1.value.remoteTrace.content.disposer;
    local_210.exception.ptr.field_1.value.remoteTrace.content.ptr = (char *)0x0;
    local_210.exception.ptr.field_1.value.remoteTrace.content.size_ = 0;
    memcpy((void *)((long)&local_3b0.super_ExceptionOrValue.exception.ptr.field_1 + 0x68),
           (void *)((long)&local_210.exception.ptr.field_1 + 0x68),0x105);
    local_3b0.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.ptr =
         local_210.exception.ptr.field_1.value.details.builder.ptr;
    local_3b0.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.pos =
         local_210.exception.ptr.field_1.value.details.builder.pos;
    local_3b0.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.endPtr =
         local_210.exception.ptr.field_1.value.details.builder.endPtr;
    local_3b0.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.disposer =
         local_210.exception.ptr.field_1.value.details.builder.disposer;
    local_210.exception.ptr.field_1.value.details.builder.ptr = (Detail *)0x0;
    local_210.exception.ptr.field_1.value.details.builder.pos =
         (RemoveConst<kj::Exception::Detail> *)0x0;
    local_210.exception.ptr.field_1.value.details.builder.endPtr = (Detail *)0x0;
    local_3b0.value.ptr.isSet = false;
    ExceptionOr<kj::_::Void>::operator=((ExceptionOr<kj::_::Void> *)output,&local_3b0);
  }
  else {
    if (local_78 != '\x01') goto LAB_00210c8d;
    *(this->func).returned = true;
    local_3b0.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_3b0.value.ptr.isSet = true;
    ExceptionOr<kj::_::Void>::operator=((ExceptionOr<kj::_::Void> *)output,&local_3b0);
  }
  if (local_3b0.super_ExceptionOrValue.exception.ptr.isSet == true) {
    Exception::~Exception(&local_3b0.super_ExceptionOrValue.exception.ptr.field_1.value);
  }
LAB_00210c8d:
  plVar1 = local_38;
  if ((local_78 == '\x01') && (local_38 != (long *)0x0)) {
    local_38 = (long *)0x0;
    (**(code **)*local_40)(local_40,(long)plVar1 + *(long *)(*plVar1 + -0x10));
  }
  if (local_210.exception.ptr.isSet == true) {
    Exception::~Exception(&local_210.exception.ptr.field_1.value);
  }
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = ExceptionOr<T>(false, kj::mv(depException));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }